

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzblockdiag.cpp
# Opt level: O0

void __thiscall
TPZBlockDiagonal<std::complex<double>_>::TPZBlockDiagonal
          (TPZBlockDiagonal<std::complex<double>_> *this,TPZVec<int> *blocksizes,
          TPZFMatrix<std::complex<double>_> *glob)

{
  undefined8 uVar1;
  int *piVar2;
  long *plVar3;
  long lVar4;
  complex<double> *pcVar5;
  long *in_RDX;
  TPZVec<int> *in_RSI;
  TPZRegisterClassId *in_RDI;
  TPZVec<std::complex<double>_> *this_00;
  TPZVec<long> *this_01;
  undefined8 uVar6;
  undefined8 uVar7;
  int64_t c;
  int64_t r;
  int64_t eq;
  int64_t pos;
  int bsize;
  int64_t neq;
  int64_t ndata;
  int64_t b;
  int64_t nblock;
  TPZVec<int> *in_stack_fffffffffffffee8;
  TPZVec<int> *in_stack_fffffffffffffef0;
  long *in_stack_ffffffffffffff00;
  int64_t in_stack_ffffffffffffff08;
  TPZVec<long> *in_stack_ffffffffffffff10;
  long local_98;
  long local_90;
  long local_88;
  complex<double> local_78;
  int local_64;
  long local_60;
  long local_58;
  long local_50;
  undefined8 local_48;
  int64_t local_40;
  undefined8 local_28;
  undefined8 local_20;
  long *local_18;
  TPZVec<int> *local_10;
  
  local_20 = 0;
  local_28 = 0x21;
  local_18 = in_RDX;
  local_10 = in_RSI;
  TPZRegisterClassId::TPZRegisterClassId<TPZBlockDiagonal<std::complex<double>>>(in_RDI,0x21);
  *(undefined8 *)(in_RDI + 10) = 0;
  *(undefined8 *)(in_RDI + 0x12) = 0;
  *(undefined8 *)in_RDI = 0;
  *(undefined8 *)(in_RDI + 8) = 0;
  TPZMatrix<std::complex<double>_>::TPZMatrix
            ((TPZMatrix<std::complex<double>_> *)in_stack_fffffffffffffef0,
             &in_stack_fffffffffffffee8->_vptr_TPZVec);
  *(undefined ***)in_RDI = &PTR__TPZBlockDiagonal_023f1580;
  this_00 = (TPZVec<std::complex<double>_> *)(in_RDI + 0x20);
  TPZVec<std::complex<double>_>::TPZVec(this_00);
  this_01 = (TPZVec<long> *)(in_RDI + 0x40);
  TPZVec<long>::TPZVec(this_01);
  TPZVec<int>::TPZVec(in_stack_fffffffffffffef0,in_stack_fffffffffffffee8);
  local_40 = TPZVec<int>::NElements(local_10);
  local_48 = 0;
  TPZVec<long>::Resize
            (in_stack_ffffffffffffff10,in_stack_ffffffffffffff08,in_stack_ffffffffffffff00);
  local_58 = 0;
  local_60 = 0;
  for (local_50 = 0; local_50 < local_40; local_50 = local_50 + 1) {
    piVar2 = TPZVec<int>::operator[](local_10,local_50);
    local_64 = *piVar2;
    plVar3 = TPZVec<long>::operator[]((TPZVec<long> *)(in_RDI + 0x40),local_50);
    lVar4 = *plVar3 + (ulong)(uint)(local_64 * local_64);
    plVar3 = TPZVec<long>::operator[]((TPZVec<long> *)(in_RDI + 0x40),local_50 + 1);
    *plVar3 = lVar4;
    local_58 = local_64 * local_64 + local_58;
    local_60 = local_64 + local_60;
  }
  uVar6 = 0;
  std::complex<double>::complex(&local_78,0.0,0.0);
  TPZVec<std::complex<double>_>::Resize(this_00,(int64_t)in_RDI,(complex<double> *)this_01);
  *(long *)(in_RDI + 8) = local_60;
  *(long *)(in_RDI + 0x10) = local_60;
  local_88 = 0;
  for (local_50 = 0; local_50 < local_40; local_50 = local_50 + 1) {
    piVar2 = TPZVec<int>::operator[]((TPZVec<int> *)(in_RDI + 0x60),local_50);
    local_64 = *piVar2;
    plVar3 = TPZVec<long>::operator[]((TPZVec<long> *)(in_RDI + 0x40),local_50);
    lVar4 = *plVar3;
    for (local_90 = 0; local_90 < local_64; local_90 = local_90 + 1) {
      for (local_98 = 0; local_98 < local_64; local_98 = local_98 + 1) {
        uVar1 = (**(code **)(*local_18 + 0x120))(local_18,local_88 + local_90,local_88 + local_98);
        uVar7 = uVar1;
        pcVar5 = TPZVec<std::complex<double>_>::operator[]
                           ((TPZVec<std::complex<double>_> *)(in_RDI + 0x20),
                            lVar4 + local_90 + local_64 * local_98);
        *(undefined8 *)pcVar5->_M_value = uVar1;
        *(undefined8 *)(pcVar5->_M_value + 8) = uVar6;
        uVar6 = uVar7;
      }
    }
    local_88 = local_64 + local_88;
  }
  return;
}

Assistant:

TPZBlockDiagonal<TVar>::TPZBlockDiagonal(const TPZVec<int> &blocksizes, const TPZFMatrix<TVar> &glob)
: TPZRegisterClassId(&TPZBlockDiagonal::ClassId),
TPZMatrix<TVar>(), fBlockSize(blocksizes)
{
	int64_t nblock = blocksizes.NElements();
	fBlockPos.Resize(nblock+1,0);
	int64_t b;
	int64_t ndata = 0;
	int64_t neq = 0;
	int bsize;
	for(b=0; b<nblock; b++) {
		bsize = blocksizes[b];
		fBlockPos[b+1] = fBlockPos[b]+bsize*bsize;
		ndata += bsize*bsize;
		neq += bsize;
	}
	fStorage.Resize(ndata,0.);
	this->fRow = neq;
	this->fCol = neq;
	int64_t pos;
	int64_t eq = 0, r, c;
	for(b=0; b<nblock; b++) {
		bsize = fBlockSize[b];
		pos = fBlockPos[b];
		for(r=0; r<bsize; r++) {
			for(c=0; c<bsize; c++) {
				fStorage[pos+r+bsize*c]= glob.GetVal(eq+r,eq+c);
			}
		}
		eq += bsize;
	}
	
}